

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderRenderCase.hpp
# Opt level: O3

void __thiscall deqp::gls::LineStream::~LineStream(LineStream *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  pcVar2 = (this->m_string)._M_dataplus._M_p;
  paVar1 = &(this->m_string).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->m_stream);
  std::ios_base::~ios_base((ios_base *)&this->field_0x78);
  return;
}

Assistant:

~LineStream		(void)				{}